

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser_members.cpp
# Opt level: O1

MemberSyntax * __thiscall
slang::parsing::Parser::parseClockingDeclaration(Parser *this,AttrList attributes)

{
  BumpAllocator *alloc;
  SyntaxNode *pSVar1;
  Token edge;
  Token name;
  Token at;
  Token semi;
  Token defaultKeyword;
  bool bVar2;
  int iVar3;
  DefaultClockingReferenceSyntax *pDVar4;
  SourceLocation SVar5;
  NameSyntax *expr;
  Diagnostic *this_00;
  undefined4 extraout_var;
  NamedBlockClauseSyntax *endBlock;
  ClockingDeclarationSyntax *pCVar6;
  __extent_storage<18446744073709551615UL> _Var7;
  long extraout_RDX;
  pointer ppAVar8;
  byte bVar9;
  byte bVar10;
  Token *this_01;
  string_view sVar11;
  Token TVar12;
  SourceRange range;
  MemberSyntax *member;
  Token endClocking;
  SmallVector<slang::syntax::MemberSyntax_*,_8UL> members;
  Token local_1b8;
  Token local_1a8;
  SignalEventExpressionSyntax *local_198;
  Token local_190;
  MemberSyntax *local_180;
  Token *local_178;
  Token *local_170;
  Info *local_168;
  undefined8 local_160;
  Info *local_158;
  undefined8 local_150;
  pointer local_148;
  size_t local_140;
  Token local_138;
  Token local_128;
  SyntaxNode *local_118;
  SyntaxNode *pSStack_110;
  pointer local_100;
  undefined8 local_f0;
  Info *pIStack_e8;
  undefined8 local_e0;
  Info *pIStack_d8;
  Token local_d0;
  SyntaxList<slang::syntax::AttributeInstanceSyntax> local_c0;
  Token local_68;
  Token local_50;
  Token local_40;
  
  _Var7 = attributes._M_extent._M_extent_value;
  ppAVar8 = attributes._M_ptr;
  Token::Token(&local_1a8);
  bVar2 = ParserBase::peek(&this->super_ParserBase,ClockingKeyword);
  if (!bVar2) {
    local_1a8 = ParserBase::consume(&this->super_ParserBase);
  }
  local_190 = ParserBase::expect(&this->super_ParserBase,ClockingKeyword);
  local_1b8 = ParserBase::consumeIf(&this->super_ParserBase,Identifier);
  if ((local_1b8.info != (Info *)0x0 && local_1a8.kind == DefaultKeyword) &&
     (bVar2 = ParserBase::peek(&this->super_ParserBase,Semicolon), defaultKeyword = local_1a8,
     TVar12 = local_1b8, bVar2)) {
    local_c0.super_SyntaxListBase.super_SyntaxNode.kind = 1;
    local_c0.super_SyntaxListBase.super_SyntaxNode.parent = (SyntaxNode *)0x0;
    local_c0.super_SyntaxListBase.super_SyntaxNode.previewNode = (SyntaxNode *)0x0;
    local_c0.super_SyntaxListBase._vptr_SyntaxListBase = (_func_int **)&PTR_getChild_005bad98;
    local_68.kind = local_1b8.kind;
    local_68._2_1_ = local_1b8._2_1_;
    local_68.numFlags.raw = local_1b8.numFlags.raw;
    local_68.rawLen = local_1b8.rawLen;
    local_68.info = local_1b8.info;
    local_1b8 = TVar12;
    local_c0.super_SyntaxListBase.childCount = _Var7._M_extent_value;
    local_c0.super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>._M_ptr =
         ppAVar8;
    local_c0.super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>._M_extent.
    _M_extent_value = _Var7._M_extent_value;
    local_d0 = ParserBase::consume(&this->super_ParserBase);
    name.info = local_68.info;
    name.kind = local_68.kind;
    name._2_1_ = local_68._2_1_;
    name.numFlags.raw = local_68.numFlags.raw;
    name.rawLen = local_68.rawLen;
    pDVar4 = slang::syntax::SyntaxFactory::defaultClockingReference
                       (&this->factory,&local_c0,defaultKeyword,local_190,name,local_d0);
    return &pDVar4->super_MemberSyntax;
  }
  if (local_1b8.info == (Info *)0x0) {
    alloc = (this->super_ParserBase).alloc;
    local_c0.super_SyntaxListBase._0_16_ = ParserBase::peek(&this->super_ParserBase);
    SVar5 = Token::location((Token *)&local_c0);
    local_1b8 = Token::createMissing(alloc,Identifier,SVar5);
  }
  if ((local_1a8.info == (Info *)0x0) && (sVar11 = Token::valueText(&local_1b8), sVar11._M_len == 0)
     ) {
    local_c0.super_SyntaxListBase._0_16_ = ParserBase::peek(&this->super_ParserBase);
    SVar5 = Token::location((Token *)&local_c0);
    ParserBase::addDiag(&this->super_ParserBase,(DiagCode)0x90005,SVar5);
  }
  TVar12 = ParserBase::expect(&this->super_ParserBase,At);
  local_158 = TVar12.info;
  local_150 = TVar12._0_8_;
  bVar2 = ParserBase::peek(&this->super_ParserBase,OpenParenthesis);
  local_148 = ppAVar8;
  local_140 = _Var7._M_extent_value;
  if (bVar2) {
    local_198 = (SignalEventExpressionSyntax *)parseEventExpression(this);
  }
  else {
    bVar2 = ParserBase::peek(&this->super_ParserBase,SystemIdentifier);
    if (bVar2) {
      this_01 = &local_40;
      Token::Token(this_01);
      expr = (NameSyntax *)
             parsePrimaryExpression(this,(bitmask<slang::parsing::detail::ExpressionOptions>)0x0);
    }
    else {
      this_01 = &local_50;
      Token::Token(this_01);
      expr = parseName(this);
    }
    edge.kind = this_01->kind;
    edge._2_1_ = this_01->field_0x2;
    edge.numFlags.raw = (this_01->numFlags).raw;
    edge.rawLen = this_01->rawLen;
    edge.info = this_01->info;
    local_198 = slang::syntax::SyntaxFactory::signalEventExpression
                          (&this->factory,edge,&expr->super_ExpressionSyntax,
                           (IffEventClauseSyntax *)0x0);
  }
  TVar12 = ParserBase::expect(&this->super_ParserBase,Semicolon);
  local_168 = TVar12.info;
  local_160 = TVar12._0_8_;
  Token::Token(&local_138);
  local_c0.super_SyntaxListBase.super_SyntaxNode._0_8_ = 0;
  local_c0.super_SyntaxListBase._vptr_SyntaxListBase = (_func_int **)((long)&local_c0 + 0x18);
  local_c0.super_SyntaxListBase.super_SyntaxNode.parent = (SyntaxNode *)0x8;
  local_170 = &(this->super_ParserBase).lastPoppedDelims.first;
  local_178 = &(this->super_ParserBase).lastPoppedDelims.second;
  bVar9 = 0;
  do {
    TVar12 = ParserBase::peek(&this->super_ParserBase);
    bVar2 = false;
    if ((TVar12.kind != EndOfFile) && ((TVar12._0_4_ & 0xffff) != 0x92)) {
      local_180 = parseClockingItem(this);
      if (local_180 == (MemberSyntax *)0x0) {
        bVar2 = slang::syntax::SyntaxFacts::isCloseDelimOrKeyword(TVar12.kind);
        if (bVar2) {
          local_128 = ParserBase::peek(&this->super_ParserBase);
          range = Token::range(&local_128);
          this_00 = ParserBase::addDiag(&this->super_ParserBase,(DiagCode)0xb80005,range);
          local_128 = ParserBase::peek(&this->super_ParserBase);
          sVar11 = Token::valueText(&local_128);
          Diagnostic::operator<<(this_00,sVar11);
          bVar9 = 1;
          if (((this->super_ParserBase).lastPoppedDelims.first.info != (Info *)0x0) &&
             ((this->super_ParserBase).lastPoppedDelims.second.info != (Info *)0x0)) {
            SVar5 = Token::location(local_170);
            Diagnostic::addNote(this_00,(DiagCode)0xc10005,SVar5);
            SVar5 = Token::location(local_178);
            Diagnostic::addNote(this_00,(DiagCode)0xc00005,SVar5);
          }
        }
        bVar10 = ~bVar9;
        bVar9 = 1;
        ParserBase::skipToken
                  (&this->super_ParserBase,
                   (optional<slang::DiagCode>)((uint6)(bVar10 & 1) << 0x20 | 0x450005));
      }
      else {
        SmallVectorBase<slang::syntax::MemberSyntax*>::
        emplace_back<slang::syntax::MemberSyntax*const&>
                  ((SmallVectorBase<slang::syntax::MemberSyntax*> *)&local_c0,&local_180);
        pSVar1 = this->previewNode;
        this->previewNode = (SyntaxNode *)0x0;
        (local_180->super_SyntaxNode).previewNode = pSVar1;
        bVar9 = 0;
      }
      bVar2 = true;
    }
  } while (bVar2);
  local_138 = ParserBase::expect(&this->super_ParserBase,EndClockingKeyword);
  iVar3 = SmallVectorBase<slang::syntax::MemberSyntax_*>::copy
                    ((SmallVectorBase<slang::syntax::MemberSyntax_*> *)&local_c0,
                     (EVP_PKEY_CTX *)(this->super_ParserBase).alloc,(EVP_PKEY_CTX *)local_138.info);
  if ((pointer)local_c0.super_SyntaxListBase._vptr_SyntaxListBase !=
      (pointer)((long)&local_c0 + 0x18U)) {
    operator_delete(local_c0.super_SyntaxListBase._vptr_SyntaxListBase);
  }
  if (extraout_RDX != 0 && local_1a8.kind == GlobalKeyword) {
    local_c0.super_SyntaxListBase._0_16_ =
         slang::syntax::SyntaxNode::getFirstToken
                   (&(*(pointer)CONCAT44(extraout_var,iVar3))->super_SyntaxNode);
    SVar5 = Token::location((Token *)&local_c0);
    ParserBase::addDiag(&this->super_ParserBase,(DiagCode)0x5d0005,SVar5);
  }
  endBlock = parseNamedBlockClause(this);
  checkBlockNames(this,local_1b8,endBlock);
  local_c0.super_SyntaxListBase.super_SyntaxNode.kind = 1;
  local_c0.super_SyntaxListBase.super_SyntaxNode.parent = (SyntaxNode *)0x0;
  local_c0.super_SyntaxListBase.super_SyntaxNode.previewNode = (SyntaxNode *)0x0;
  local_c0.super_SyntaxListBase.childCount = local_140;
  local_c0.super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>._M_ptr =
       local_148;
  local_c0.super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>._M_extent.
  _M_extent_value = local_140;
  local_c0.super_SyntaxListBase._vptr_SyntaxListBase = (_func_int **)&PTR_getChild_005bad98;
  local_e0 = local_150;
  pIStack_d8 = local_158;
  local_f0 = local_160;
  pIStack_e8 = local_168;
  local_128.info._0_4_ = 1;
  local_118 = (SyntaxNode *)0x0;
  pSStack_110 = (SyntaxNode *)0x0;
  local_128._0_8_ = &PTR_getChild_005bae20;
  at.info = local_158;
  at.kind = (undefined2)local_150;
  at._2_1_ = local_150._2_1_;
  at.numFlags.raw = local_150._3_1_;
  at.rawLen = local_150._4_4_;
  semi.info = local_168;
  semi.kind = (undefined2)local_160;
  semi._2_1_ = local_160._2_1_;
  semi.numFlags.raw = local_160._3_1_;
  semi.rawLen = local_160._4_4_;
  local_100 = (pointer)CONCAT44(extraout_var,iVar3);
  pCVar6 = slang::syntax::SyntaxFactory::clockingDeclaration
                     (&this->factory,&local_c0,local_1a8,local_190,local_1b8,at,
                      &local_198->super_EventExpressionSyntax,semi,
                      (SyntaxList<slang::syntax::MemberSyntax> *)&local_128,local_138,endBlock);
  return &pCVar6->super_MemberSyntax;
}

Assistant:

MemberSyntax& Parser::parseClockingDeclaration(AttrList attributes) {
    Token globalOrDefault;
    if (!peek(TokenKind::ClockingKeyword))
        globalOrDefault = consume();

    Token clocking = expect(TokenKind::ClockingKeyword);
    Token blockName = consumeIf(TokenKind::Identifier);

    // If this is a default reference there is no body to parse.
    if (globalOrDefault.kind == TokenKind::DefaultKeyword && blockName &&
        peek(TokenKind::Semicolon)) {
        return factory.defaultClockingReference(attributes, globalOrDefault, clocking, blockName,
                                                consume());
    }

    if (!blockName)
        blockName = Token::createMissing(alloc, TokenKind::Identifier, peek().location());

    if (!globalOrDefault && blockName.valueText().empty())
        addDiag(diag::ClockingNameEmpty, peek().location());

    Token at = expect(TokenKind::At);

    EventExpressionSyntax* event;
    if (peek(TokenKind::OpenParenthesis)) {
        event = &parseEventExpression();
    }
    else if (peek(TokenKind::SystemIdentifier)) {
        event = &factory.signalEventExpression({}, parsePrimaryExpression(ExpressionOptions::None),
                                               nullptr);
    }
    else {
        event = &factory.signalEventExpression({}, parseName(), nullptr);
    }

    Token semi = expect(TokenKind::Semicolon);
    Token endClocking;
    auto members = parseMemberList<MemberSyntax>(
        TokenKind::EndClockingKeyword, endClocking, SyntaxKind::ClockingDeclaration,
        [this](SyntaxKind, bool&) { return parseClockingItem(); });

    if (globalOrDefault.kind == TokenKind::GlobalKeyword && !members.empty())
        addDiag(diag::GlobalClockingEmpty, members[0]->getFirstToken().location());

    NamedBlockClauseSyntax* endBlockName = parseNamedBlockClause();
    checkBlockNames(blockName, endBlockName);

    return factory.clockingDeclaration(attributes, globalOrDefault, clocking, blockName, at, *event,
                                       semi, members, endClocking, endBlockName);
}